

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ReduceSumSquareLayerParams::ReduceSumSquareLayerParams
          (ReduceSumSquareLayerParams *this)

{
  ReduceSumSquareLayerParams *pRVar1;
  ReduceSumSquareLayerParams *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__ReduceSumSquareLayerParams_00571a10;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  google::protobuf::RepeatedField<long>::RepeatedField(&this->axes_);
  pRVar1 = internal_default_instance();
  if (this != pRVar1) {
    protobuf_NeuralNetwork_2eproto::InitDefaults();
  }
  SharedCtor(this);
  return;
}

Assistant:

ReduceSumSquareLayerParams::ReduceSumSquareLayerParams()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_NeuralNetwork_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.ReduceSumSquareLayerParams)
}